

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

int resolve_addr_index(dwarf_sections *dwarf_sections,uint64_t addr_base,int addrsize,
                      int is_bigendian,uint64_t addr_index,backtrace_error_callback error_callback,
                      void *data,uintptr_t *address)

{
  ulong uVar1;
  bool bVar2;
  uint64_t uVar3;
  long lVar4;
  undefined1 local_50 [8];
  dwarf_buf addr_buf;
  
  lVar4 = addr_index * (long)addrsize + addr_base;
  uVar1 = dwarf_sections->size[5];
  bVar2 = (ulong)(addrsize + lVar4) <= uVar1;
  if (bVar2) {
    local_50 = (undefined1  [8])0x1371c0;
    addr_buf.name = (char *)dwarf_sections->data[5];
    addr_buf.start = (uchar *)addr_buf.name + lVar4;
    addr_buf.buf = (uchar *)(uVar1 - lVar4);
    addr_buf.error_callback = (backtrace_error_callback)data;
    addr_buf.data._0_4_ = 0;
    addr_buf.left._0_4_ = is_bigendian;
    addr_buf._32_8_ = error_callback;
    uVar3 = read_address((dwarf_buf *)local_50,addrsize);
    *address = uVar3;
  }
  else {
    (*error_callback)(data,"DW_FORM_addrx value out of range",0);
  }
  return (uint)bVar2;
}

Assistant:

static int
resolve_addr_index (const struct dwarf_sections *dwarf_sections,
		    uint64_t addr_base, int addrsize, int is_bigendian,
		    uint64_t addr_index,
		    backtrace_error_callback error_callback, void *data,
		    uintptr_t *address)
{
  uint64_t offset;
  struct dwarf_buf addr_buf;

  offset = addr_index * addrsize + addr_base;
  if (offset + addrsize > dwarf_sections->size[DEBUG_ADDR])
    {
      error_callback (data, "DW_FORM_addrx value out of range", 0);
      return 0;
    }

  addr_buf.name = ".debug_addr";
  addr_buf.start = dwarf_sections->data[DEBUG_ADDR];
  addr_buf.buf = dwarf_sections->data[DEBUG_ADDR] + offset;
  addr_buf.left = dwarf_sections->size[DEBUG_ADDR] - offset;
  addr_buf.is_bigendian = is_bigendian;
  addr_buf.error_callback = error_callback;
  addr_buf.data = data;
  addr_buf.reported_underflow = 0;

  *address = (uintptr_t) read_address (&addr_buf, addrsize);
  return 1;
}